

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_rope::build_graph(test_rope *this,ggml_context *ctx)

{
  long lVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  long ne0;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  array<long,_4UL> ne;
  
  if ((this->v & 1) == 0) {
    pgVar3 = test_case::ggml_new_tensor
                       (&this->super_test_case,ctx,this->type,4,(this->ne_a)._M_elems);
    if (this->forward == true) {
      ggml_set_param(ctx,pgVar3);
    }
    pcVar6 = "a";
  }
  else {
    ne._M_elems[3] = (this->ne_a)._M_elems[3];
    ne._M_elems[0] = (this->ne_a)._M_elems[0] << 1;
    ne._M_elems[1] = (this->ne_a)._M_elems[1] << 2;
    ne._M_elems[2] = (this->ne_a)._M_elems[2] * 3;
    pgVar3 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,ne._M_elems);
    if (this->forward == true) {
      ggml_set_param(ctx,pgVar3);
    }
    ggml_set_name(pgVar3,"a");
    pgVar3 = (ggml_tensor *)
             ggml_view_4d(ctx,pgVar3,(this->ne_a)._M_elems[0],(this->ne_a)._M_elems[1],
                          (this->ne_a)._M_elems[2],(this->ne_a)._M_elems[3],(int)pgVar3->nb[1],
                          pgVar3->nb[2],pgVar3->nb[3],0);
    pcVar6 = "view_of_a";
  }
  ggml_set_name(pgVar3,pcVar6);
  uVar2 = this->mode;
  lVar1 = (this->ne_a)._M_elems[2];
  ne0 = lVar1 * 4;
  if ((uVar2 & 8) == 0) {
    ne0 = lVar1;
  }
  pgVar4 = test_case::ggml_new_tensor_1d(&this->super_test_case,ctx,GGML_TYPE_I32,ne0);
  uVar9 = 0x12ce62;
  ggml_set_name(pgVar4,"pos");
  if (this->ff == true) {
    pgVar5 = test_case::ggml_new_tensor_1d
                       (&this->super_test_case,ctx,GGML_TYPE_F32,(long)(this->n_dims / 2));
    uVar9 = 0x12ce95;
    ggml_set_name(pgVar5,"freq");
  }
  else {
    pgVar5 = (ggml_tensor *)0x0;
  }
  if ((uVar2 & 8) == 0) {
    if (this->forward == true) {
      uVar8 = 0;
      pgVar3 = (ggml_tensor *)ggml_rope_ext(0x461c4000,ctx,pgVar3,pgVar4,pgVar5);
    }
    else {
      uVar8 = 0;
      pgVar3 = (ggml_tensor *)
               ggml_rope_ext_back(0x461c4000,this->fs,this->ef,this->af,0x3f800000,0x3f800000,ctx,
                                  pgVar3,pgVar4,pgVar5,this->n_dims,this->mode);
    }
  }
  else {
    uVar7 = this->n_dims;
    if (uVar2 == 0x18) {
      if ((int)uVar7 < 4) {
        pcVar6 = "n_dims/4 > 0";
        uVar9 = 0xa1b;
LAB_0012d043:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                   ,uVar9,"GGML_ASSERT(%s) failed",pcVar6);
      }
      ne._M_elems[0] = CONCAT44(uVar7 >> 2,uVar7 >> 2);
      ne._M_elems[1] = 0;
      uVar7 = uVar7 >> 1;
    }
    else {
      if ((int)uVar7 < 3) {
        pcVar6 = "n_dims/3 > 0";
        uVar9 = 0xa23;
        goto LAB_0012d043;
      }
      uVar2 = uVar7 / 3;
      ne._M_elems[0] = CONCAT44(uVar2,uVar2);
      ne._M_elems[1] = (long)uVar2;
    }
    uVar8 = (ulong)(uint)this->mode;
    if (this->forward == true) {
      uVar9 = 0;
      pgVar3 = (ggml_tensor *)ggml_rope_multi(0x461c4000,ctx,pgVar3,pgVar4,pgVar5,uVar7,&ne);
    }
    else {
      uVar9 = 0;
      pgVar3 = (ggml_tensor *)
               ggml_rope_multi_back
                         (0x461c4000,this->fs,this->ef,this->af,0x3f800000,0x3f800000,ctx,pgVar3,
                          pgVar4,pgVar5,uVar7,&ne);
    }
  }
  ggml_set_name(pgVar3,"out",uVar9,uVar8);
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            if (forward) {
                ggml_set_param(ctx, a);
            }
            ggml_set_name(a, "a");
        }

        const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
        const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

        ggml_tensor * pos;
        if (is_mrope || is_vision) {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2] * 4);
        } else {
            pos = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, ne_a[2]);
        }
        ggml_set_name(pos, "pos");

        ggml_tensor * freq = nullptr;
        if (ff) {
            freq = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_dims/2);
            ggml_set_name(freq, "freq");
        }

        ggml_tensor * out;
        if (is_mrope) {
            if (is_vision) {
                GGML_ASSERT(n_dims/4 > 0);
                int rope_sections[4] = {n_dims/4, n_dims/4, 0, 0}; // Vision-RoPE only use first two dimension for image (x, y) coordinate
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims/2, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            } else {
                GGML_ASSERT(n_dims/3 > 0);
                int rope_sections[4] = {n_dims/3, n_dims/3, n_dims/3, 0};
                if (forward) {
                    out = ggml_rope_multi     (ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                } else {
                    out = ggml_rope_multi_back(ctx, a, pos, freq, n_dims, rope_sections, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
                }
            }
        } else {
            if (forward) {
                out = ggml_rope_ext     (ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            } else {
                out = ggml_rope_ext_back(ctx, a, pos, freq, n_dims, mode, 0, 10000.0f, fs, ef, af, 1.0f, 1.0f);
            }
        }
        ggml_set_name(out, "out");

        return out;
    }